

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  byte bVar2;
  int index;
  int key;
  ExtensionSet *this_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  LogMessageFatal aLStack_40 [16];
  ulong uStack_30;
  undefined1 auStack_28 [16];
  
  this_00 = (ExtensionSet *)auStack_28;
  key = (int)auStack_28;
  uStack_30 = 0x259cd0;
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated != false) goto LAB_00259d43;
    if ((byte)(pEVar1->type - 0x13) < 0xee) goto LAB_00259d53;
    this_00 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
      bVar2 = pEVar1->field_0xa;
      goto LAB_00259d29;
    }
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      uStack_30 = 0x259d43;
      SetEnum((ExtensionSet *)auStack_28);
LAB_00259d43:
      uStack_30 = 0x259d4b;
      SetEnum((ExtensionSet *)auStack_28);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 8) {
      pEVar1->is_repeated = false;
      bVar2 = pEVar1->field_0xa & 0xfe;
LAB_00259d29:
      pEVar1->field_0xa = bVar2 & 0xfd;
      (pEVar1->field_0).enum_value = value;
      return;
    }
    uStack_30 = 0x259d53;
    SetEnum();
LAB_00259d53:
    uStack_30 = 0x259d5b;
    SetEnum((ExtensionSet *)auStack_28);
  }
  uStack_30 = 0x259d63;
  SetEnum();
  uStack_30 = (ulong)(uint)value;
  pEVar1 = FindOrNull(this_00,key);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1f8,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_40,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_00259df9;
  }
  if (pEVar1->is_repeated == false) {
    GetRepeatedEnum();
LAB_00259de9:
    GetRepeatedEnum();
  }
  else {
    if ((byte)(pEVar1->type - 0x13) < 0xee) goto LAB_00259de9;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8) {
      RepeatedField<int>::Get((RepeatedField<int> *)pEVar1->field_0,index);
      return;
    }
  }
  GetRepeatedEnum();
LAB_00259df9:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_40);
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
    extension->is_pointer = false;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}